

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::SIMDLoadStoreLane::finalize(SIMDLoadStoreLane *this)

{
  Expression *pEVar1;
  Expression *pEVar2;
  
  pEVar1 = this->ptr;
  if ((pEVar1 != (Expression *)0x0) && (pEVar2 = this->vec, pEVar2 != (Expression *)0x0)) {
    if ((ulong)this->op < 8) {
      (this->super_SpecificExpression<(wasm::Expression::Id)35>).super_Expression.type.id =
           *(uintptr_t *)(&DAT_00e2e710 + (ulong)this->op * 8);
      if (((pEVar1->type).id == 1) || ((pEVar2->type).id == 1)) {
        (this->super_SpecificExpression<(wasm::Expression::Id)35>).super_Expression.type.id = 1;
      }
      return;
    }
    handle_unreachable("unexpected op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                       ,0x214);
  }
  __assert_fail("ptr && vec",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x1ee,"void wasm::SIMDLoadStoreLane::finalize()");
}

Assistant:

void SIMDLoadStoreLane::finalize() {
  assert(ptr && vec);
  type = isLoad() ? Type::v128 : Type::none;
  if (ptr->type == Type::unreachable || vec->type == Type::unreachable) {
    type = Type::unreachable;
  }
}